

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix2 * matrix2_inverse(matrix2 *self,matrix2 *mR)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = (self->field_0).m[0];
  fVar2 = (self->field_0).m[1];
  fVar3 = (self->field_0).m[2];
  fVar4 = fVar1 * (self->field_0).m[3] - fVar2 * fVar3;
  fVar5 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar5 = fVar4;
  }
  if (1e-05 <= fVar5) {
    fVar4 = 1.0 / fVar4;
    (mR->field_0).m[0] = fVar4 * (self->field_0).m[3];
    (mR->field_0).m[1] = fVar4 * -fVar2;
    (mR->field_0).m[2] = fVar4 * -fVar3;
    (mR->field_0).m[3] = fVar4 * fVar1;
    return mR;
  }
  return (matrix2 *)0x0;
}

Assistant:

HYPAPI struct matrix2 *matrix2_inverse(const struct matrix2 *self, struct matrix2 *mR)
{
	struct matrix2 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix2_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	/* find the adjugate of self */
	inverse.c00 = self->c11;
	inverse.c01 = -self->c01;
	inverse.c10 = -self->c10;
	inverse.c11 = self->c00;

	/* divide the determinant */
	for (i = 0; i < 4; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}